

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

void glob_addtopath(t_pd *dummy,t_symbol *path,t_float saveit)

{
  t_symbol *ptVar1;
  t_namelist *ptVar2;
  long lVar3;
  
  ptVar1 = sys_decodedialog(path);
  if (*ptVar1->s_name != '\0') {
    lVar3 = 8;
    if ((int)saveit < 0) {
      lVar3 = 0x20;
    }
    ptVar2 = namelist_append_files
                       (*(t_namelist **)((long)&(pd_maininstance.pd_stuff)->st_externlist + lVar3),
                        ptVar1->s_name);
    *(t_namelist **)((long)&(pd_maininstance.pd_stuff)->st_externlist + lVar3) = ptVar2;
    if (0.0 < saveit) {
      sys_savepreferences((char *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void glob_addtopath(t_pd *dummy, t_symbol *path, t_float saveit)
{
    int saveflag = (int)saveit;
    t_symbol *s = sys_decodedialog(path);
    if (*s->s_name)
    {
        if (saveflag < 0)
            STUFF->st_temppath =
                namelist_append_files(STUFF->st_temppath, s->s_name);
        else
            STUFF->st_searchpath =
                namelist_append_files(STUFF->st_searchpath, s->s_name);
        if (saveit > 0)
            sys_savepreferences(0);
    }
}